

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ewmh.c
# Opt level: O0

void ewmh_init(natwm_state *state)

{
  __pid_t _Var1;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 uVar2;
  size_t len;
  xcb_atom_t net_atoms [16];
  size_t wm_name_len;
  pid_t pid;
  natwm_state *state_local;
  
  uVar2 = 0x10af37;
  _Var1 = getpid();
  len._0_4_ = state->ewmh->_NET_SUPPORTED;
  len._4_4_ = state->ewmh->_NET_NUMBER_OF_DESKTOPS;
  net_atoms[0] = state->ewmh->_NET_DESKTOP_VIEWPORT;
  net_atoms[1] = state->ewmh->_NET_CURRENT_DESKTOP;
  net_atoms[2] = state->ewmh->_NET_DESKTOP_NAMES;
  net_atoms[3] = state->ewmh->_NET_ACTIVE_WINDOW;
  net_atoms[4] = state->ewmh->_NET_SUPPORTING_WM_CHECK;
  net_atoms[5] = state->ewmh->_NET_CLOSE_WINDOW;
  net_atoms[6] = state->ewmh->_NET_MOVERESIZE_WINDOW;
  net_atoms[7] = state->ewmh->_NET_REQUEST_FRAME_EXTENTS;
  net_atoms[8] = state->ewmh->_NET_WM_DESKTOP;
  net_atoms[9] = state->ewmh->_NET_WM_WINDOW_TYPE;
  net_atoms[10] = state->ewmh->_NET_WM_STATE;
  net_atoms[0xb] = state->ewmh->_NET_WM_PID;
  net_atoms[0xc] = state->ewmh->_NET_WM_WINDOW_TYPE_NORMAL;
  net_atoms[0xd] = state->ewmh->_NET_WM_STATE_FULLSCREEN;
  xcb_ewmh_set_supported(state->ewmh,state->screen_num,0x10,&len,in_R8,in_R9,uVar2);
  xcb_ewmh_set_wm_pid(state->ewmh,state->screen->root,_Var1);
  xcb_ewmh_set_wm_name(state->ewmh,state->screen->root,0xc,"natwm v0.0.1");
  ewmh_supporting_window = create_supporting_window(state);
  xcb_ewmh_set_supporting_wm_check(state->ewmh,state->screen->root,ewmh_supporting_window);
  xcb_ewmh_set_supporting_wm_check(state->ewmh,ewmh_supporting_window,ewmh_supporting_window);
  xcb_ewmh_set_wm_name(state->ewmh,ewmh_supporting_window,0xc,"natwm v0.0.1");
  xcb_icccm_set_wm_class(state->xcb,ewmh_supporting_window,0x1f,"supporting_window");
  xcb_ewmh_set_number_of_desktops(state->ewmh,state->screen_num,10);
  return;
}

Assistant:

void ewmh_init(const struct natwm_state *state)
{
        pid_t pid = getpid();
        size_t wm_name_len = strlen(NATWM_VERSION_STRING);

        // A list of supported atoms
        //
        // More info can be found in the spec
        // https://standards.freedesktop.org/wm-spec/wm-spec-latest.html
        xcb_atom_t net_atoms[] = {
                // Root window properties
                state->ewmh->_NET_SUPPORTED,
                state->ewmh->_NET_NUMBER_OF_DESKTOPS,
                state->ewmh->_NET_DESKTOP_VIEWPORT,
                state->ewmh->_NET_CURRENT_DESKTOP,
                state->ewmh->_NET_DESKTOP_NAMES,
                state->ewmh->_NET_ACTIVE_WINDOW,
                state->ewmh->_NET_SUPPORTING_WM_CHECK,
                // Root messages
                state->ewmh->_NET_CLOSE_WINDOW,
                state->ewmh->_NET_MOVERESIZE_WINDOW,
                state->ewmh->_NET_REQUEST_FRAME_EXTENTS,
                // Application window properties
                state->ewmh->_NET_WM_DESKTOP,
                state->ewmh->_NET_WM_WINDOW_TYPE,
                state->ewmh->_NET_WM_STATE,
                state->ewmh->_NET_WM_PID,
                // Window types
                // TODO: Add more
                state->ewmh->_NET_WM_WINDOW_TYPE_NORMAL,
                // Window States
                state->ewmh->_NET_WM_STATE_FULLSCREEN,
        };

        size_t len = (sizeof(net_atoms) / sizeof(xcb_atom_t));

        xcb_ewmh_set_supported(state->ewmh, state->screen_num, (uint32_t)len, net_atoms);

        xcb_ewmh_set_wm_pid(state->ewmh, state->screen->root, (uint32_t)pid);
        xcb_ewmh_set_wm_name(
                state->ewmh, state->screen->root, (uint32_t)wm_name_len, NATWM_VERSION_STRING);

        ewmh_supporting_window = create_supporting_window(state);

        xcb_ewmh_set_supporting_wm_check(state->ewmh, state->screen->root, ewmh_supporting_window);
        xcb_ewmh_set_supporting_wm_check(
                state->ewmh, ewmh_supporting_window, ewmh_supporting_window);

        // Set the WM name on the supporting win
        xcb_ewmh_set_wm_name(
                state->ewmh, ewmh_supporting_window, (uint32_t)wm_name_len, NATWM_VERSION_STRING);

        xcb_icccm_set_wm_class(state->xcb,
                               ewmh_supporting_window,
                               sizeof(SUPPORTING_WINDOW_CLASS_NAME),
                               SUPPORTING_WINDOW_CLASS_NAME);

        xcb_ewmh_set_number_of_desktops(
                state->ewmh, state->screen_num, (uint32_t)NATWM_WORKSPACE_COUNT);
}